

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetPchSource
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  cmMakefile *this_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  cmGlobalGenerator *this_01;
  string *psVar4;
  mapped_type *pmVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  _Var6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a10;
  undefined1 local_970 [8];
  cmGeneratedFileStream file;
  cmAlphaNum local_6d8;
  undefined1 local_6a8 [8];
  string filename_tmp;
  cmAlphaNum local_658;
  byte local_622;
  allocator<char> local_621;
  string local_620;
  cmAlphaNum local_600;
  cmAlphaNum local_5d0;
  string local_5a0;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_57a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_579;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_578;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_570;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_530;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b0;
  iterator local_470;
  size_type local_468;
  undefined1 local_460 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  languageToExtension_1;
  cmAlphaNum local_400;
  byte local_3ca;
  allocator<char> local_3c9;
  string local_3c8;
  cmAlphaNum local_3a8;
  cmAlphaNum local_378;
  string local_348;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_322;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_321;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_320;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  iterator local_218;
  size_type local_210;
  undefined1 local_208 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  languageToExtension;
  string local_1d0;
  cmAlphaNum local_1b0;
  cmAlphaNum local_180;
  string local_150;
  allocator<char> local_129;
  string local_128;
  cmValue local_108;
  cmValue pchReuseFrom;
  cmGeneratorTarget *generatorTarget;
  string *filename;
  undefined1 local_e8 [8];
  string pchHeader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_68;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  inserted;
  string *arch_local;
  string *language_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  inserted._8_8_ = arch;
  bVar1 = std::operator!=(language,"C");
  if ((((bVar1) && (bVar1 = std::operator!=(language,"CXX"), bVar1)) &&
      (bVar1 = std::operator!=(language,"OBJC"), bVar1)) &&
     (bVar1 = std::operator!=(language,"OBJCXX"), bVar1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::operator+(&local_a8,language,config);
    std::operator+(&local_88,&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   inserted._8_8_);
    std::make_pair<std::__cxx11::string,char_const(&)[1]>
              (&local_68,&local_88,(char (*) [1])0xd97e77);
    _Var6 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,char_const*>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&this->PchSources,&local_68);
    pchHeader.field_2._8_8_ = _Var6.first._M_node;
    inserted.first._M_node._0_1_ = _Var6.second;
    local_40._M_node = (_Base_ptr)pchHeader.field_2._8_8_;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
    ::~pair(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    if (((byte)inserted.first._M_node & 1) != 0) {
      GetPchHeader((string *)local_e8,this,config,language,(string *)inserted._8_8_);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_40);
        str = &ppVar3->second;
        pchReuseFrom.Value = (string *)this;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"PRECOMPILE_HEADERS_REUSE_FROM",&local_129);
        local_108 = GetProperty(this,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator(&local_129);
        bVar1 = cmValue::operator_cast_to_bool(&local_108);
        if (bVar1) {
          this_01 = GetGlobalGenerator(this);
          psVar4 = cmValue::operator*[abi_cxx11_(&local_108);
          pchReuseFrom.Value = (string *)cmGlobalGenerator::FindGeneratorTarget(this_01,psVar4);
        }
        psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                           ((cmLocalGenerator *)
                            ((pchReuseFrom.Value)->field_2)._M_allocated_capacity);
        cmAlphaNum::cmAlphaNum(&local_180,psVar4);
        cmAlphaNum::cmAlphaNum(&local_1b0,"/CMakeFiles/");
        psVar4 = GetName_abi_cxx11_(pchReuseFrom.Value);
        cmStrCat<std::__cxx11::string,char[15]>
                  (&local_150,&local_180,&local_1b0,psVar4,(char (*) [15])".dir/cmake_pch");
        std::__cxx11::string::operator=((string *)str,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        this_00 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,"CMAKE_LINK_PCH",
                   (allocator<char> *)
                   ((long)&languageToExtension._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
                  );
        bVar1 = cmMakefile::IsOn(this_00,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&languageToExtension._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
                  );
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_578 = &local_570;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
                    (local_578,(char (*) [2])0xd3f4fb,(char (*) [3])0xdb36d6);
          local_578 = &local_530;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
                    (local_578,(char (*) [4])0xd2c925,(char (*) [5])0xd68523);
          local_578 = &local_4f0;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
                    (local_578,(char (*) [5])"OBJC",(char (*) [3])0xd15603);
          local_578 = &local_4b0;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[7],_const_char_(&)[4],_true>
                    (local_578,(char (*) [7])"OBJCXX",(char (*) [4])0xd649c7);
          local_470 = &local_570;
          local_468 = 4;
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::allocator(&local_57a);
          __l._M_len = local_468;
          __l._M_array = local_470;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_460,__l,&local_579,&local_57a);
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~allocator(&local_57a);
          local_a68 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_470;
          do {
            local_a68 = local_a68 + -1;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(local_a68);
          } while (local_a68 != &local_570);
          cmAlphaNum::cmAlphaNum(&local_5d0,str);
          uVar2 = std::__cxx11::string::empty();
          local_622 = 0;
          if ((uVar2 & 1) == 0) {
            cmAlphaNum::cmAlphaNum(&local_658,"_");
            cmAlphaNum::cmAlphaNum
                      ((cmAlphaNum *)((long)&filename_tmp.field_2 + 8),(string *)inserted._8_8_);
            cmStrCat<>(&local_620,&local_658,(cmAlphaNum *)((long)&filename_tmp.field_2 + 8));
          }
          else {
            std::allocator<char>::allocator();
            local_622 = 1;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"",&local_621);
          }
          cmAlphaNum::cmAlphaNum(&local_600,&local_620);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_460,language);
          cmStrCat<std::__cxx11::string>(&local_5a0,&local_5d0,&local_600,pmVar5);
          std::__cxx11::string::operator=((string *)str,(string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_620);
          if ((local_622 & 1) != 0) {
            std::allocator<char>::~allocator(&local_621);
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_460);
        }
        else {
          local_320 = &local_318;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[2],_const_char_(&)[5],_true>
                    (local_320,(char (*) [2])0xd3f4fb,(char (*) [5])".h.c");
          local_320 = &local_2d8;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[4],_const_char_(&)[9],_true>
                    (local_320,(char (*) [4])0xd2c925,(char (*) [9])".hxx.cxx");
          local_320 = &local_298;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[5],_const_char_(&)[10],_true>
                    (local_320,(char (*) [5])"OBJC",(char (*) [10])".objc.h.m");
          local_320 = &local_258;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[7],_const_char_(&)[15],_true>
                    (local_320,(char (*) [7])"OBJCXX",(char (*) [15])".objcxx.hxx.mm");
          local_218 = &local_318;
          local_210 = 4;
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::allocator(&local_322);
          __l_00._M_len = local_210;
          __l_00._M_array = local_218;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_208,__l_00,&local_321,&local_322);
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~allocator(&local_322);
          local_a10 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_218;
          do {
            local_a10 = local_a10 + -1;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(local_a10);
          } while (local_a10 != &local_318);
          cmAlphaNum::cmAlphaNum(&local_378,str);
          uVar2 = std::__cxx11::string::empty();
          local_3ca = 0;
          if ((uVar2 & 1) == 0) {
            cmAlphaNum::cmAlphaNum(&local_400,"_");
            cmAlphaNum::cmAlphaNum
                      ((cmAlphaNum *)
                       &languageToExtension_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)inserted._8_8_);
            cmStrCat<>(&local_3c8,&local_400,
                       (cmAlphaNum *)
                       &languageToExtension_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          else {
            std::allocator<char>::allocator();
            local_3ca = 1;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"",&local_3c9);
          }
          cmAlphaNum::cmAlphaNum(&local_3a8,&local_3c8);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_208,language);
          cmStrCat<std::__cxx11::string>(&local_348,&local_378,&local_3a8,pmVar5);
          std::__cxx11::string::operator=((string *)str,(string *)&local_348);
          std::__cxx11::string::~string((string *)&local_348);
          std::__cxx11::string::~string((string *)&local_3c8);
          if ((local_3ca & 1) != 0) {
            std::allocator<char>::~allocator(&local_3c9);
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_208);
        }
        cmAlphaNum::cmAlphaNum(&local_6d8,str);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&file.field_0x260,".tmp");
        cmStrCat<>((string *)local_6a8,&local_6d8,(cmAlphaNum *)&file.field_0x260);
        bVar1 = cmValue::operator_cast_to_bool(&local_108);
        if (!bVar1) {
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)local_970,(string *)local_6a8,false,None);
          std::operator<<((ostream *)local_970,"/* generated by CMake */\n");
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_970);
          cmFileTimes::Copy((string *)local_e8,(string *)local_6a8);
          cmSystemTools::MoveFileIfDifferent((string *)local_6a8,str);
        }
        std::__cxx11::string::~string((string *)local_6a8);
        bVar1 = false;
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)local_e8);
      if (bVar1) {
        return __return_storage_ptr__;
      }
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_40);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar3->second);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchSource(const std::string& config,
                                            const std::string& language,
                                            const std::string& arch) const
{
  if (language != "C" && language != "CXX" && language != "OBJC" &&
      language != "OBJCXX") {
    return std::string();
  }
  const auto inserted =
    this->PchSources.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    const std::string pchHeader = this->GetPchHeader(config, language, arch);
    if (pchHeader.empty()) {
      return std::string();
    }
    std::string& filename = inserted.first->second;

    const cmGeneratorTarget* generatorTarget = this;
    cmValue pchReuseFrom =
      generatorTarget->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");
    if (pchReuseFrom) {
      generatorTarget =
        this->GetGlobalGenerator()->FindGeneratorTarget(*pchReuseFrom);
    }

    filename =
      cmStrCat(generatorTarget->LocalGenerator->GetCurrentBinaryDirectory(),
               "/CMakeFiles/", generatorTarget->GetName(), ".dir/cmake_pch");

    // For GCC the source extension will be transformed into .h[xx].gch
    if (!this->Makefile->IsOn("CMAKE_LINK_PCH")) {
      const std::map<std::string, std::string> languageToExtension = {
        { "C", ".h.c" },
        { "CXX", ".hxx.cxx" },
        { "OBJC", ".objc.h.m" },
        { "OBJCXX", ".objcxx.hxx.mm" }
      };

      filename = cmStrCat(filename, arch.empty() ? "" : cmStrCat("_", arch),
                          languageToExtension.at(language));
    } else {
      const std::map<std::string, std::string> languageToExtension = {
        { "C", ".c" }, { "CXX", ".cxx" }, { "OBJC", ".m" }, { "OBJCXX", ".mm" }
      };

      filename = cmStrCat(filename, arch.empty() ? "" : cmStrCat("_", arch),
                          languageToExtension.at(language));
    }

    const std::string filename_tmp = cmStrCat(filename, ".tmp");
    if (!pchReuseFrom) {
      {
        cmGeneratedFileStream file(filename_tmp);
        file << "/* generated by CMake */\n";
      }
      cmFileTimes::Copy(pchHeader, filename_tmp);
      cmSystemTools::MoveFileIfDifferent(filename_tmp, filename);
    }
  }
  return inserted.first->second;
}